

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O0

Maybe<capnp::compiler::BrandedDecl> * __thiscall
capnp::compiler::BrandedDecl::applyParams
          (Maybe<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandedDecl *this,
          Array<capnp::compiler::BrandedDecl> *params,Reader subSource)

{
  Reader source;
  bool bVar1;
  BrandScope *params_00;
  Array<capnp::compiler::BrandedDecl> *other;
  anon_class_16_2_4e2af6e8 local_a8;
  SegmentReader *local_98;
  CapTableReader *pCStack_90;
  void *local_88;
  WirePointer *pWStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  Array<capnp::compiler::BrandedDecl> local_50;
  Array<capnp::compiler::BrandedDecl> *local_20;
  Array<capnp::compiler::BrandedDecl> *params_local;
  BrandedDecl *this_local;
  
  local_20 = params;
  params_local = (Array<capnp::compiler::BrandedDecl> *)this;
  this_local = (BrandedDecl *)__return_storage_ptr__;
  bVar1 = kj::
          OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
          ::is<capnp::compiler::Resolver::ResolvedParameter>(&this->body);
  if (bVar1) {
    kj::Maybe<capnp::compiler::BrandedDecl>::Maybe(__return_storage_ptr__);
  }
  else {
    params_00 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->(&this->brand);
    other = kj::mv<kj::Array<capnp::compiler::BrandedDecl>>(params);
    kj::Array<capnp::compiler::BrandedDecl>::Array(&local_50,other);
    kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
    ::get<capnp::compiler::Resolver::ResolvedDecl>(&this->body);
    source = subSource;
    local_98 = subSource._reader.segment;
    pCStack_90 = subSource._reader.capTable;
    local_88 = subSource._reader.data;
    pWStack_80 = subSource._reader.pointers;
    local_78._0_4_ = subSource._reader.dataSize;
    local_78._4_2_ = subSource._reader.pointerCount;
    local_78._6_2_ = subSource._reader._38_2_;
    subSource._reader._40_8_ = source._reader._40_8_;
    uStack_70._0_4_ = subSource._reader.nestingLimit;
    uStack_70._4_4_ = subSource._reader._44_4_;
    subSource = source;
    BrandScope::setParams
              ((BrandScope *)&stack0xffffffffffffffc8,
               (Array<capnp::compiler::BrandedDecl> *)params_00,(Which)&local_50,source);
    local_a8.this = this;
    local_a8.subSource = &subSource;
    kj::Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_>::
    map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_generics_c__:51:14)>
              (__return_storage_ptr__,
               (Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
               &stack0xffffffffffffffc8,&local_a8);
    kj::Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_>::~Maybe
              ((Maybe<kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>_> *)
               &stack0xffffffffffffffc8);
    kj::Array<capnp::compiler::BrandedDecl>::~Array(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<BrandedDecl> BrandedDecl::applyParams(
    kj::Array<BrandedDecl> params, Expression::Reader subSource) {
  if (body.is<Resolver::ResolvedParameter>()) {
    return kj::none;
  } else {
    return brand->setParams(kj::mv(params), body.get<Resolver::ResolvedDecl>().kind, subSource)
        .map([&](kj::Own<BrandScope>&& scope) {
      BrandedDecl result = *this;
      result.brand = kj::mv(scope);
      result.source = subSource;
      return result;
    });
  }
}